

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolOcclusionTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::QueryPool::anon_unknown_0::OcclusionQueryTestInstance::iterate
          (TestStatus *__return_storage_ptr__,OcclusionQueryTestInstance *this)

{
  StateObjects *this_00;
  pointer this_01;
  bool bVar1;
  VkResult VVar2;
  VkQueue pVVar3;
  DeviceInterface *vk_00;
  TestContext *this_02;
  reference pvVar4;
  allocator<char> local_319;
  string local_318;
  undefined4 local_2f8;
  allocator<char> local_2f1;
  string local_2f0;
  byte local_2ca;
  allocator<char> local_2c9;
  undefined1 local_2c8 [6];
  bool passed;
  allocator<char> local_2a1;
  string local_2a0;
  LogSection local_280;
  byte local_239;
  bool allowNotReady;
  deUint64 queryAvailability [3];
  deUint64 local_218;
  deUint64 queryResults [3];
  undefined8 uStack_1f8;
  VkSubmitInfo submitInfo;
  undefined8 uStack_1a8;
  VkSubmitInfo submitInfoRender;
  undefined8 uStack_158;
  VkSubmitInfo submitInfoReset;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_108;
  Vector<float,_4> local_ec;
  Vector<float,_4> local_dc;
  Vector<float,_4> local_cc;
  Vector<float,_4> local_bc;
  Vector<float,_4> local_ac;
  Vector<float,_4> local_9c;
  Vector<float,_4> local_8c;
  Vector<float,_4> local_7c;
  Vector<float,_4> local_6c [2];
  allocator<tcu::Vector<float,_4>_> local_49;
  undefined1 local_48 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> vertices;
  TestLog *log;
  DeviceInterface *vk;
  VkQueue queue;
  OcclusionQueryTestInstance *this_local;
  
  pVVar3 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  vk_00 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  this_02 = Context::getTestContext((this->super_TestInstance).m_context);
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)tcu::TestContext::getLog(this_02);
  std::allocator<tcu::Vector<float,_4>_>::allocator(&local_49);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_48,9,
             &local_49);
  std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_49);
  tcu::Vector<float,_4>::Vector(local_6c,0.5,0.5,0.5,1.0);
  pvVar4 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      local_48,0);
  *(undefined8 *)pvVar4->m_data = local_6c[0].m_data._0_8_;
  *(undefined8 *)(pvVar4->m_data + 2) = local_6c[0].m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_7c,0.5,-0.5,0.5,1.0);
  pvVar4 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      local_48,1);
  *(undefined8 *)pvVar4->m_data = local_7c.m_data._0_8_;
  *(undefined8 *)(pvVar4->m_data + 2) = local_7c.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_8c,-0.5,0.5,0.5,1.0);
  pvVar4 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      local_48,2);
  *(undefined8 *)pvVar4->m_data = local_8c.m_data._0_8_;
  *(undefined8 *)(pvVar4->m_data + 2) = local_8c.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_9c,-0.5,-0.5,1.0,1.0);
  pvVar4 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      local_48,3);
  *(undefined8 *)pvVar4->m_data = local_9c.m_data._0_8_;
  *(undefined8 *)(pvVar4->m_data + 2) = local_9c.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_ac,0.5,-0.5,1.0,1.0);
  pvVar4 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      local_48,4);
  *(undefined8 *)pvVar4->m_data = local_ac.m_data._0_8_;
  *(undefined8 *)(pvVar4->m_data + 2) = local_ac.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_bc,-0.5,0.5,1.0,1.0);
  pvVar4 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      local_48,5);
  *(undefined8 *)pvVar4->m_data = local_bc.m_data._0_8_;
  *(undefined8 *)(pvVar4->m_data + 2) = local_bc.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_cc,0.5,0.5,1.0,1.0);
  pvVar4 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      local_48,6);
  *(undefined8 *)pvVar4->m_data = local_cc.m_data._0_8_;
  *(undefined8 *)(pvVar4->m_data + 2) = local_cc.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_dc,0.5,-0.5,1.0,1.0);
  pvVar4 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      local_48,7);
  *(undefined8 *)pvVar4->m_data = local_dc.m_data._0_8_;
  *(undefined8 *)(pvVar4->m_data + 2) = local_dc.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_ec,-0.5,0.5,1.0,1.0);
  pvVar4 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      local_48,8);
  *(undefined8 *)pvVar4->m_data = local_ec.m_data._0_8_;
  *(undefined8 *)(pvVar4->m_data + 2) = local_ec.m_data._8_8_;
  this_00 = this->m_stateObjects;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&local_108,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_48);
  StateObjects::setVertices(this_00,vk_00,&local_108);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector(&local_108);
  bVar1 = hasSeparateResetCmdBuf(this);
  if (bVar1) {
    submitInfoReset.commandBufferCount = 0;
    submitInfoReset._44_4_ = 0;
    submitInfoReset.pCommandBuffers = (VkCommandBuffer *)0x0;
    submitInfoReset.pWaitSemaphores = (VkSemaphore *)0x0;
    submitInfoReset.pNext = (void *)0x0;
    submitInfoReset.waitSemaphoreCount = 0;
    submitInfoReset._20_4_ = 0;
    submitInfoReset.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    submitInfoReset._4_4_ = 0;
    submitInfoReset.signalSemaphoreCount = 0;
    submitInfoReset._60_4_ = 0;
    uStack_158 = 4;
    submitInfoReset.pWaitDstStageMask = (VkPipelineStageFlags *)0x1;
    submitInfoReset._40_8_ =
         ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                   (&(this->m_queryPoolResetCommandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
    ::vk::Handle<(vk::HandleType)6>::Handle
              ((Handle<(vk::HandleType)6> *)&submitInfoRender.pSignalSemaphores,0);
    (*vk_00->_vptr_DeviceInterface[2])
              (vk_00,pVVar3,1,&uStack_158,submitInfoRender.pSignalSemaphores);
    VVar2 = (*vk_00->_vptr_DeviceInterface[3])(vk_00,pVVar3);
    ::vk::checkResult(VVar2,"vk.queueWaitIdle(queue)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolOcclusionTests.cpp"
                      ,0x292);
  }
  submitInfoRender.commandBufferCount = 0;
  submitInfoRender._44_4_ = 0;
  submitInfoRender.pCommandBuffers = (VkCommandBuffer *)0x0;
  submitInfoRender.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfoRender.pNext = (void *)0x0;
  submitInfoRender.waitSemaphoreCount = 0;
  submitInfoRender._20_4_ = 0;
  submitInfoRender.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfoRender._4_4_ = 0;
  submitInfoRender.signalSemaphoreCount = 0;
  submitInfoRender._60_4_ = 0;
  uStack_1a8 = 4;
  submitInfoRender.pWaitDstStageMask = (VkPipelineStageFlags *)0x1;
  submitInfoRender._40_8_ =
       ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                 (&(this->m_renderCommandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  ::vk::Handle<(vk::HandleType)6>::Handle
            ((Handle<(vk::HandleType)6> *)&submitInfo.pSignalSemaphores,0);
  (*vk_00->_vptr_DeviceInterface[2])(vk_00,pVVar3,1,&uStack_1a8,submitInfo.pSignalSemaphores);
  if ((this->m_testVector).queryWait == WAIT_QUEUE) {
    VVar2 = (*vk_00->_vptr_DeviceInterface[3])(vk_00,pVVar3);
    ::vk::checkResult(VVar2,"vk.queueWaitIdle(queue)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolOcclusionTests.cpp"
                      ,0x2a7);
  }
  bVar1 = hasSeparateCopyCmdBuf(this);
  if (bVar1) {
    submitInfo.commandBufferCount = 0;
    submitInfo._44_4_ = 0;
    submitInfo.pCommandBuffers = (VkCommandBuffer *)0x0;
    submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
    submitInfo.pNext = (void *)0x0;
    submitInfo.waitSemaphoreCount = 0;
    submitInfo._20_4_ = 0;
    submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    submitInfo._4_4_ = 0;
    submitInfo.signalSemaphoreCount = 0;
    submitInfo._60_4_ = 0;
    uStack_1f8 = 4;
    submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x1;
    submitInfo._40_8_ =
         ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                   (&(this->m_copyResultsCommandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
    ::vk::Handle<(vk::HandleType)6>::Handle((Handle<(vk::HandleType)6> *)(queryResults + 2),0);
    (*vk_00->_vptr_DeviceInterface[2])(vk_00,pVVar3,1,&uStack_1f8,queryResults[2]);
  }
  if ((this->m_testVector).queryResultsMode == RESULTS_MODE_COPY) {
    VVar2 = (*vk_00->_vptr_DeviceInterface[3])(vk_00,pVVar3);
    ::vk::checkResult(VVar2,"vk.queueWaitIdle(queue)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolOcclusionTests.cpp"
                      ,0x2c5);
  }
  local_239 = (this->m_testVector).queryWait == WAIT_NONE;
  captureResults(this,&local_218,(deUint64 *)&stack0xfffffffffffffdc8,(bool)local_239);
  this_01 = vertices.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"OcclusionQueryResults",&local_2a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2c8,"Occlusion query results",&local_2c9);
  tcu::LogSection::LogSection(&local_280,&local_2a0,(string *)local_2c8);
  tcu::TestLog::operator<<((TestLog *)this_01,&local_280);
  tcu::LogSection::~LogSection(&local_280);
  std::__cxx11::string::~string((string *)local_2c8);
  std::allocator<char>::~allocator(&local_2c9);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  logResults(this,&local_218,(deUint64 *)&stack0xfffffffffffffdc8);
  local_2ca = validateResults(this,&local_218,(deUint64 *)&stack0xfffffffffffffdc8,
                              (bool)(local_239 & 1),(this->m_testVector).primitiveTopology);
  tcu::TestLog::operator<<
            ((TestLog *)
             vertices.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage,
             (EndSectionToken *)&tcu::TestLog::EndSection);
  if ((this->m_testVector).queryResultsMode != RESULTS_MODE_COPY) {
    VVar2 = (*vk_00->_vptr_DeviceInterface[3])(vk_00,pVVar3);
    ::vk::checkResult(VVar2,"vk.queueWaitIdle(queue)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolOcclusionTests.cpp"
                      ,0x2d9);
  }
  if ((local_2ca & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_318,"Query result verification failed",&local_319);
    tcu::TestStatus::TestStatus(__return_storage_ptr__,QP_TEST_RESULT_FAIL,&local_318);
    std::__cxx11::string::~string((string *)&local_318);
    std::allocator<char>::~allocator(&local_319);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f0,"Query result verification passed",&local_2f1);
    tcu::TestStatus::TestStatus(__return_storage_ptr__,QP_TEST_RESULT_PASS,&local_2f0);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::allocator<char>::~allocator(&local_2f1);
  }
  local_2f8 = 1;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus OcclusionQueryTestInstance::iterate (void)
{
	const vk::VkQueue			queue		= m_context.getUniversalQueue();
	const vk::DeviceInterface&	vk			= m_context.getDeviceInterface();
	tcu::TestLog&				log			= m_context.getTestContext().getLog();
	std::vector<tcu::Vec4>		vertices	(NUM_VERTICES);

	// 1st triangle
	vertices[START_VERTEX + 0] = tcu::Vec4( 0.5,  0.5, 0.5, 1.0);
	vertices[START_VERTEX + 1] = tcu::Vec4( 0.5, -0.5, 0.5, 1.0);
	vertices[START_VERTEX + 2] = tcu::Vec4(-0.5,  0.5, 0.5, 1.0);
	// 2nd triangle - partially occluding the scene
	vertices[START_VERTEX_PARTIALLY_OCCLUDED + 0] = tcu::Vec4(-0.5, -0.5, 1.0, 1.0);
	vertices[START_VERTEX_PARTIALLY_OCCLUDED + 1] = tcu::Vec4( 0.5, -0.5, 1.0, 1.0);
	vertices[START_VERTEX_PARTIALLY_OCCLUDED + 2] = tcu::Vec4(-0.5,  0.5, 1.0, 1.0);
	// 3nd triangle - fully occluding the scene
	vertices[START_VERTEX_OCCLUDER + 0] = tcu::Vec4( 0.5,  0.5, 1.0, 1.0);
	vertices[START_VERTEX_OCCLUDER + 1] = tcu::Vec4( 0.5, -0.5, 1.0, 1.0);
	vertices[START_VERTEX_OCCLUDER + 2] = tcu::Vec4(-0.5,  0.5, 1.0, 1.0);

	m_stateObjects->setVertices(vk, vertices);

	if (hasSeparateResetCmdBuf())
	{
		const vk::VkSubmitInfo		submitInfoReset =
		{
			vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,			// VkStructureType			sType;
			DE_NULL,									// const void*				pNext;
			0u,											// deUint32					waitSemaphoreCount;
			DE_NULL,									// const VkSemaphore*		pWaitSemaphores;
			(const vk::VkPipelineStageFlags*)DE_NULL,
			1u,											// deUint32					commandBufferCount;
			&m_queryPoolResetCommandBuffer.get(),		// const VkCommandBuffer*	pCommandBuffers;
			0u,											// deUint32					signalSemaphoreCount;
			DE_NULL										// const VkSemaphore*		pSignalSemaphores;
		};

		vk.queueSubmit(queue, 1, &submitInfoReset, DE_NULL);

		// Trivially wait for reset to complete. This is to ensure the query pool is in reset state before
		// host accesses, so as to not insert any synchronization before capturing the results needed for WAIT_NONE
		// variant of test.
		VK_CHECK(vk.queueWaitIdle(queue));
	}

	{
		const vk::VkSubmitInfo submitInfoRender =
		{
			vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
			DE_NULL,							// const void*				pNext;
			0,									// deUint32					waitSemaphoreCount;
			DE_NULL,							// const VkSemaphore*		pWaitSemaphores;
			(const vk::VkPipelineStageFlags*)DE_NULL,
			1,									// deUint32					commandBufferCount;
			&m_renderCommandBuffer.get(),		// const VkCommandBuffer*	pCommandBuffers;
			0,									// deUint32					signalSemaphoreCount;
			DE_NULL								// const VkSemaphore*		pSignalSemaphores;
		};
		vk.queueSubmit(queue, 1, &submitInfoRender, DE_NULL);
	}

	if (m_testVector.queryWait == WAIT_QUEUE)
	{
		VK_CHECK(vk.queueWaitIdle(queue));
	}

	if (hasSeparateCopyCmdBuf())
	{
		// In case of WAIT_QUEUE test variant, the previously submitted m_renderCommandBuffer did not
		// contain vkCmdCopyQueryResults, so additional cmd buffer is needed.

		// In the case of WAIT_NONE or WAIT_QUERY, vkCmdCopyQueryResults is stored in m_renderCommandBuffer.

		const vk::VkSubmitInfo submitInfo =
		{
			vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
			DE_NULL,							// const void*				pNext;
			0,									// deUint32					waitSemaphoreCount;
			DE_NULL,							// const VkSemaphore*		pWaitSemaphores;
			(const vk::VkPipelineStageFlags*)DE_NULL,
			1,									// deUint32					commandBufferCount;
			&m_copyResultsCommandBuffer.get(),	// const VkCommandBuffer*	pCommandBuffers;
			0,									// deUint32					signalSemaphoreCount;
			DE_NULL								// const VkSemaphore*		pSignalSemaphores;
		};
		vk.queueSubmit(queue, 1, &submitInfo, DE_NULL);
	}

	if (m_testVector.queryResultsMode == RESULTS_MODE_COPY)
	{
		// In case of vkCmdCopyQueryResults is used, test must always wait for it
		// to complete before we can read the result buffer.

		VK_CHECK(vk.queueWaitIdle(queue));
	}

	deUint64 queryResults		[NUM_QUERIES_IN_POOL];
	deUint64 queryAvailability	[NUM_QUERIES_IN_POOL];

	// Allow not ready results only if nobody waited before getting the query results
	bool	allowNotReady		= (m_testVector.queryWait == WAIT_NONE);

	captureResults(queryResults, queryAvailability, allowNotReady);

	log << tcu::TestLog::Section("OcclusionQueryResults", "Occlusion query results");

	logResults(queryResults, queryAvailability);
	bool passed = validateResults(queryResults, queryAvailability, allowNotReady, m_testVector.primitiveTopology);

	log << tcu::TestLog::EndSection;

	if (m_testVector.queryResultsMode != RESULTS_MODE_COPY)
	{
		VK_CHECK(vk.queueWaitIdle(queue));
	}

		if (passed)
	{
		return tcu::TestStatus(QP_TEST_RESULT_PASS, "Query result verification passed");
	}
	return tcu::TestStatus(QP_TEST_RESULT_FAIL, "Query result verification failed");
}